

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

Vec_Ptr_t * Aig_ManMuxesCollect(Aig_Man_t *pAig)

{
  int iVar1;
  Vec_Ptr_t *p;
  Aig_Obj_t *pObj_00;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMuxes;
  Aig_Man_t *pAig_local;
  
  p = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_24);
    if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
       (iVar1 = Aig_ObjIsMuxType(pObj_00), iVar1 != 0)) {
      Vec_PtrPush(p,pObj_00);
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t * Aig_ManMuxesCollect( Aig_Man_t * pAig )
{
    Vec_Ptr_t * vMuxes;
    Aig_Obj_t * pObj;
    int i;
    vMuxes = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjIsMuxType(pObj) )
            Vec_PtrPush( vMuxes, pObj );
    return vMuxes;
}